

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O1

void __thiscall bintree::updateOnce(bintree *this,vec2 *target)

{
  bool bVar1;
  uint32_t uVar2;
  leb_Node extraout_RDX;
  uint32_t nodeID;
  leb_DiamondParent diamond;
  leb_Node node;
  leb_Node local_60;
  leb_DiamondParent local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar2 = leb__HeapRead(this->m_leb,(leb_Node)0x1);
  if (uVar2 != 0) {
    nodeID = 0;
    do {
      local_60 = leb_DecodeNode(this->m_leb,nodeID);
      if (this->m_pingPong == 1) {
        if (g_params.flags.freeze == false) {
          if (g_params.mode == 0) {
            local_58 = leb_DecodeDiamondParent(local_60);
          }
          else {
            local_58 = leb_DecodeDiamondParent_Quad(local_60);
          }
          bVar1 = testTarget(this,&local_58.base,target);
          if ((!bVar1) && (bVar1 = testTarget(this,&local_58.top,target), !bVar1)) {
            diamond.top = local_58.top;
            diamond.base = extraout_RDX;
            leb_MergeNodeConforming(this->m_leb,local_60,diamond);
          }
        }
      }
      else if (((this->m_pingPong == 0) && (g_params.flags.freeze == false)) &&
              (bVar1 = testTarget(this,&local_60,target), bVar1)) {
        if (g_params.mode == 0) {
          leb_SplitNodeConforming(this->m_leb,local_60);
        }
        else {
          leb_SplitNodeConforming_Quad(this->m_leb,local_60);
        }
      }
      nodeID = nodeID + 1;
    } while (uVar2 != nodeID);
  }
  leb_ComputeSumReduction(this->m_leb);
  precomputeNodes(&local_48,this);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  this->m_pingPong = 1 - this->m_pingPong;
  return;
}

Assistant:

void updateOnce(const dja::vec2 &target)
    {
        uint32_t cnt = leb_NodeCount(m_leb);

        // update
        for (uint32_t i = 0; i < cnt; ++i) {
            leb_Node node = leb_DecodeNode(m_leb, i);

            if /* splitting pass */(m_pingPong == 0 && !g_params.flags.freeze) {
                bool isInside = testTarget(node, target);

                /* split */
                if (isInside) {
                    if (g_params.mode == MODE_TRIANGLE) {
                        leb_SplitNodeConforming(m_leb, node);
                    } else {
                        leb_SplitNodeConforming_Quad(m_leb, node);
                    }
                }
            } else if /* merging pass */(m_pingPong == 1 && !g_params.flags.freeze) {
                leb_DiamondParent diamond;

                if (g_params.mode == MODE_TRIANGLE) {
                    diamond = leb_DecodeDiamondParent(node);
                } else {
                    diamond = leb_DecodeDiamondParent_Quad(node);
                }

                bool shouldMerge = !testTarget(diamond.base, target)
                                 && !testTarget(diamond.top, target);

                if (shouldMerge) {
                    if (g_params.mode == MODE_TRIANGLE) {
                        leb_MergeNodeConforming(m_leb, node, diamond);
                    } else {
                        leb_MergeNodeConforming_Quad(m_leb, node, diamond);
                    }
                }
            }
        }

        leb_ComputeSumReduction(m_leb);

        precomputeNodes();
        m_pingPong = 1 - m_pingPong;
    }